

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

void * flatcc_builder_get_direct_buffer(flatcc_builder_t *B,size_t *size_out)

{
  if ((B->is_default_emitter != 0) &&
     ((B->default_emit_context).front == (B->default_emit_context).back)) {
    if (size_out != (size_t *)0x0) {
      *size_out = (B->default_emit_context).used;
    }
    return (B->default_emit_context).front_cursor;
  }
  if (size_out != (size_t *)0x0) {
    *size_out = 0;
  }
  return (void *)0x0;
}

Assistant:

void *flatcc_builder_get_direct_buffer(flatcc_builder_t *B, size_t *size_out)
{
    if (B->is_default_emitter) {
        return flatcc_emitter_get_direct_buffer(&B->default_emit_context, size_out);
    } else {
        if (size_out) {
            *size_out = 0;
        }
    }
    return 0;
}